

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O3

Am_Wrapper * color_from_panel_proc(Am_Object *param_1)

{
  int iVar1;
  Am_Value *pAVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  Am_Wrapper *pAVar6;
  Am_Style *this;
  Am_String s;
  Am_Value value;
  Am_String local_28;
  Am_Value local_20;
  
  local_20.type = 0;
  local_20.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = (Am_Value *)Am_Object::Get(0xa5b0,0x169);
  Am_Value::operator=(&local_20,pAVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Color Value = ",0xe);
  plVar3 = (long *)operator<<((ostream *)&std::cout,&local_20);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::ostream::flush();
  if (local_20.type != 0x8008) {
    pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
    goto LAB_0010b176;
  }
  local_28.data = (Am_String_Data *)0x0;
  Am_String::operator=(&local_28,&local_20);
  pcVar4 = Am_String::operator_cast_to_char_(&local_28);
  if (pcVar4 == (char *)0x0) {
LAB_0010b13b:
    this = (Am_Style *)&Am_White;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"new color = ",0xc);
    pcVar4 = Am_String::operator_cast_to_char_(&local_28);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11b430);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    std::ostream::flush();
    pcVar4 = Am_String::operator_cast_to_char_(&local_28);
    iVar1 = strcmp(pcVar4,"Red");
    if (iVar1 == 0) {
      this = (Am_Style *)&Am_Red;
    }
    else {
      pcVar4 = Am_String::operator_cast_to_char_(&local_28);
      iVar1 = strcmp(pcVar4,"Blue");
      if (iVar1 == 0) {
        this = (Am_Style *)&Am_Blue;
      }
      else {
        pcVar4 = Am_String::operator_cast_to_char_(&local_28);
        iVar1 = strcmp(pcVar4,"Green");
        if (iVar1 == 0) {
          this = (Am_Style *)&Am_Green;
        }
        else {
          pcVar4 = Am_String::operator_cast_to_char_(&local_28);
          iVar1 = strcmp(pcVar4,"Yellow");
          if (iVar1 == 0) {
            this = (Am_Style *)&Am_Yellow;
          }
          else {
            pcVar4 = Am_String::operator_cast_to_char_(&local_28);
            iVar1 = strcmp(pcVar4,"Orange");
            if (iVar1 != 0) goto LAB_0010b13b;
            this = (Am_Style *)&Am_Orange;
          }
        }
      }
    }
  }
  pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_(this);
  Am_String::~Am_String(&local_28);
LAB_0010b176:
  Am_Value::~Am_Value(&local_20);
  return pAVar6;
}

Assistant:

Am_Define_No_Self_Formula(bool, on_left_form)
{
  Am_Value value;
  // get the value from the checkbox widget's value.
  value = checkboxes.Peek(Am_VALUE);
  return !find_in_list(value, ON_RIGHT);
}